

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[21],unsigned_long,char[32],unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [21],unsigned_long *Args_1,
          char (*Args_2) [32],uint *Args_3,char (*Args_4) [3])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [3];
  uint *Args_local_3;
  char (*Args_local_2) [32];
  unsigned_long *Args_local_1;
  char (*Args_local) [21];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[21],unsigned_long,char[32],unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [21])this,(unsigned_long *)Args,(char (*) [32])Args_1,(uint *)Args_2,
             (char (*) [3])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}